

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O3

uint64_t aom_mse_wxh_16bit_highbd_avx2
                   (uint16_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  if (w == 8) {
    if (0 < h) {
      uVar3 = 0;
      auVar5 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar8._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + (long)dstride * 2) +
             ZEXT116(1) * *(undefined1 (*) [16])dst;
        auVar8._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + (long)dstride * 2);
        auVar13._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)sstride * 2) +
             ZEXT116(1) * *(undefined1 (*) [16])src;
        auVar13._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)sstride * 2);
        auVar8 = vpsubw_avx2(auVar13,auVar8);
        auVar8 = vpabsw_avx2(auVar8);
        auVar4 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar7 = vpunpcklwd_avx2(auVar8,auVar4);
        auVar13 = vpunpckhwd_avx2(auVar8,auVar4);
        auVar8 = vpmaddwd_avx2(auVar7,auVar7);
        auVar7 = vpmaddwd_avx2(auVar13,auVar13);
        auVar13 = vpunpckldq_avx2(auVar8,auVar4);
        auVar8 = vpunpckhdq_avx2(auVar8,auVar4);
        auVar8 = vpaddq_avx2(auVar5._0_32_,auVar8);
        auVar12 = vpunpckldq_avx2(auVar7,auVar4);
        auVar13 = vpaddq_avx2(auVar13,auVar12);
        auVar8 = vpaddq_avx2(auVar8,auVar13);
        auVar13 = vpunpckhdq_avx2(auVar7,auVar4);
        auVar8 = vpaddq_avx2(auVar8,auVar13);
        auVar5 = ZEXT3264(auVar8);
        uVar3 = uVar3 + 2;
        src = (uint16_t *)(*(undefined1 (*) [16])src + (long)sstride * 4);
        dst = (uint16_t *)(*(undefined1 (*) [16])dst + (long)dstride * 4);
      } while (uVar3 < (uint)h);
      goto LAB_0038e9f2;
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    if (0 < h) {
      lVar1 = (long)sstride;
      lVar2 = (long)dstride;
      uVar3 = 0;
      auVar5 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)((long)dst + lVar2 * 6);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)((long)dst + lVar2 * 4);
        auVar6 = vpunpcklqdq_avx(auVar9,auVar6);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)((long)dst + lVar2 * 2);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)dst;
        auVar9 = vpunpcklqdq_avx(auVar14,auVar10);
        auVar7._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar9;
        auVar7._16_16_ = ZEXT116(1) * auVar6;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)src + lVar1 * 6);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)src + lVar1 * 4);
        auVar6 = vpunpcklqdq_avx(auVar15,auVar11);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)((long)src + lVar1 * 2);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)src;
        auVar9 = vpunpcklqdq_avx(auVar17,auVar16);
        auVar12._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar9;
        auVar12._16_16_ = ZEXT116(1) * auVar6;
        auVar8 = vpsubw_avx2(auVar12,auVar7);
        auVar8 = vpabsw_avx2(auVar8);
        auVar4 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar7 = vpunpcklwd_avx2(auVar8,auVar4);
        auVar13 = vpunpckhwd_avx2(auVar8,auVar4);
        auVar8 = vpmaddwd_avx2(auVar7,auVar7);
        auVar7 = vpmaddwd_avx2(auVar13,auVar13);
        auVar13 = vpunpckldq_avx2(auVar8,auVar4);
        auVar8 = vpunpckhdq_avx2(auVar8,auVar4);
        auVar8 = vpaddq_avx2(auVar5._0_32_,auVar8);
        auVar12 = vpunpckldq_avx2(auVar7,auVar4);
        auVar13 = vpaddq_avx2(auVar13,auVar12);
        auVar8 = vpaddq_avx2(auVar8,auVar13);
        auVar13 = vpunpckhdq_avx2(auVar7,auVar4);
        auVar8 = vpaddq_avx2(auVar8,auVar13);
        auVar5 = ZEXT3264(auVar8);
        uVar3 = uVar3 + 4;
        src = (uint16_t *)((long)src + lVar1 * 8);
        dst = (uint16_t *)((long)dst + lVar2 * 8);
      } while (uVar3 < (uint)h);
      goto LAB_0038e9f2;
    }
  }
  auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
LAB_0038e9f2:
  auVar6 = vpaddq_avx(auVar8._0_16_,auVar8._16_16_);
  auVar9 = vpshufd_avx(auVar6,0xee);
  auVar6 = vpaddq_avx(auVar6,auVar9);
  return auVar6._0_8_;
}

Assistant:

uint64_t aom_mse_wxh_16bit_highbd_avx2(uint16_t *dst, int dstride,
                                       uint16_t *src, int sstride, int w,
                                       int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_highbd_avx2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_highbd_avx2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}